

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::init
          (ViewportCallOrderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  RenderContext *pRVar2;
  ContextInfo *pCVar3;
  NotSupportedError *pNVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  char *local_210;
  char *local_208;
  MessageBuilder local_200;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  byte local_11;
  ViewportCallOrderCase *pVStack_10;
  bool supportsES32;
  ViewportCallOrderCase *this_local;
  
  pVStack_10 = this;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  if (!(bool)local_11) {
    pCVar3 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_primitive_bounding_box");
    if (!bVar1) {
      local_55 = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Test requires GL_EXT_primitive_bounding_box extension",
                 &local_41);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_40);
      local_55 = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((local_11 & 1) == 0) {
    pCVar3 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_tessellation_shader");
    if (!bVar1) {
      local_7a = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Test requires GL_EXT_tessellation_shader extension",&local_79)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_78);
      local_7a = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_200,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_200,
                      (char (*) [80])
                      "Testing call order of state setting functions have no effect on the rendering.\n"
                     );
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [59])
                             "Setting viewport and bounding box in the following order:\n");
  local_208 = "\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n";
  if (this->m_callOrder == VIEWPORT_FIRST) {
    local_208 = "\tFirst viewport with glViewport function.\n";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_208);
  local_210 = "\tThen viewport with glViewport function.\n";
  if (this->m_callOrder == VIEWPORT_FIRST) {
    local_210 = "\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [28])"Verifying rendering result.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_200);
  genVbo(this);
  genProgram(this);
  return extraout_EAX;
}

Assistant:

void ViewportCallOrderCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing call order of state setting functions have no effect on the rendering.\n"
		<< "Setting viewport and bounding box in the following order:\n"
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tFirst viewport with glViewport function.\n")
				: ("\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n"))
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n")
				: ("\tThen viewport with glViewport function.\n"))
		<< "Verifying rendering result."
		<< tcu::TestLog::EndMessage;

	// resources
	genVbo();
	genProgram();
}